

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

string * __thiscall
compiler::AssemblerCompiler::do_assignment_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Assignment *assignment)

{
  bool bVar1;
  socklen_t *in_RCX;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(assignment->expression->super_Object)._vptr_Object[1])(&local_50);
  bVar1 = std::operator==(&local_50,"Const");
  std::__cxx11::string::~string((string *)&local_50);
  __lhs = "MOV ";
  if (bVar1) {
    __lhs = "MOVC ";
  }
  Var::accept_abi_cxx11_((Var *)&local_50,(int)assignment->variable,(sockaddr *)this,in_RCX);
  std::operator+(&local_b0,__lhs,&local_50);
  std::operator+(&local_90,&local_b0," ");
  (**(assignment->expression->super_Object)._vptr_Object)(&local_d0,assignment->expression,this);
  std::operator+(&local_70,&local_90,&local_d0);
  std::operator+(__return_storage_ptr__,&local_70,";");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_assignment(const Assignment *assignment) {
    auto common_prefix = [&] {
        if (assignment->expression->describe() == "Const") {
            return "MOVC ";
        } else {
            return "MOV ";
        }
    };
    return common_prefix() + assignment->variable->accept(this) + " " + assignment->expression->accept(this) + ";";
}